

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar8;
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  vbool<4> vVar27;
  bool bVar28;
  uint uVar29;
  undefined4 uVar30;
  int iVar31;
  long lVar32;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar33;
  size_t sVar34;
  size_t sVar35;
  uint uVar36;
  NodeRef *pNVar37;
  NodeRef root;
  long lVar38;
  long lVar39;
  ulong uVar40;
  float fVar41;
  float fVar42;
  vint4 ai_2;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar53;
  undefined1 in_ZMM0 [64];
  vint4 bi;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  vint4 bi_1;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 bi_3;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar83;
  float fVar84;
  vint4 ai;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 ai_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [16];
  vint4 ai_3;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  uint uVar104;
  uint uVar106;
  uint uVar107;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar105;
  uint uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<4> terminated;
  undefined1 local_19c8 [16];
  undefined1 local_19a8 [16];
  BVH *local_1998;
  Intersectors *local_1990;
  long local_1988;
  long local_1980;
  undefined1 local_1978 [16];
  undefined1 local_1968 [16];
  TravRayK<4,_false> tray;
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined1 local_1838 [16];
  undefined1 local_1828 [8];
  float fStack_1820;
  float fStack_181c;
  undefined1 local_1818 [8];
  float fStack_1810;
  float fStack_180c;
  undefined1 local_1808 [8];
  float fStack_1800;
  float fStack_17fc;
  vfloat<4> t;
  vfloat<4> v;
  vfloat<4> u;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1798;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined1 local_1758 [8];
  float fStack_1750;
  float fStack_174c;
  undefined1 local_1748 [8];
  float fStack_1740;
  float fStack_173c;
  undefined1 local_1738 [16];
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  uint uStack_1718;
  uint uStack_1714;
  uint uStack_1710;
  uint uStack_170c;
  Vec3vf<4> Ng;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar26 = mm_lookupmask_ps._8_8_;
  uVar25 = mm_lookupmask_ps._0_8_;
  local_1998 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_1998->root).ptr;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar70 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar62 = vpcmpeqd_avx(auVar70,(undefined1  [16])valid_i->field_0);
    auVar49 = ZEXT816(0) << 0x40;
    auVar9 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar49,5);
    auVar61 = auVar62 & auVar9;
    if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar61[0xf] < '\0')
    {
      auVar9 = vandps_avx(auVar9,auVar62);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar98._8_4_ = 0x7fffffff;
      auVar98._0_8_ = 0x7fffffff7fffffff;
      auVar98._12_4_ = 0x7fffffff;
      auVar62 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar90._8_4_ = 0x219392ef;
      auVar90._0_8_ = 0x219392ef219392ef;
      auVar90._12_4_ = 0x219392ef;
      auVar62 = vcmpps_avx(auVar62,auVar90,1);
      auVar61 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar90,auVar62);
      auVar62 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar62 = vcmpps_avx(auVar62,auVar90,1);
      auVar79 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar90,auVar62);
      auVar62 = vandps_avx(auVar98,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar62 = vcmpps_avx(auVar62,auVar90,1);
      auVar62 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar90,auVar62);
      auVar74 = vrcpps_avx(auVar61);
      fVar42 = auVar74._0_4_;
      auVar71._0_4_ = auVar61._0_4_ * fVar42;
      fVar52 = auVar74._4_4_;
      auVar71._4_4_ = auVar61._4_4_ * fVar52;
      fVar54 = auVar74._8_4_;
      auVar71._8_4_ = auVar61._8_4_ * fVar54;
      fVar56 = auVar74._12_4_;
      auVar71._12_4_ = auVar61._12_4_ * fVar56;
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar61 = vsubps_avx(auVar91,auVar71);
      tray.rdir.field_0._0_4_ = fVar42 + fVar42 * auVar61._0_4_;
      tray.rdir.field_0._4_4_ = fVar52 + fVar52 * auVar61._4_4_;
      tray.rdir.field_0._8_4_ = fVar54 + fVar54 * auVar61._8_4_;
      tray.rdir.field_0._12_4_ = fVar56 + fVar56 * auVar61._12_4_;
      auVar61 = vrcpps_avx(auVar79);
      fVar42 = auVar61._0_4_;
      auVar74._0_4_ = auVar79._0_4_ * fVar42;
      fVar52 = auVar61._4_4_;
      auVar74._4_4_ = auVar79._4_4_ * fVar52;
      fVar54 = auVar61._8_4_;
      auVar74._8_4_ = auVar79._8_4_ * fVar54;
      fVar56 = auVar61._12_4_;
      auVar74._12_4_ = auVar79._12_4_ * fVar56;
      auVar61 = vsubps_avx(auVar91,auVar74);
      tray.rdir.field_0._16_4_ = fVar42 + fVar42 * auVar61._0_4_;
      tray.rdir.field_0._20_4_ = fVar52 + fVar52 * auVar61._4_4_;
      tray.rdir.field_0._24_4_ = fVar54 + fVar54 * auVar61._8_4_;
      tray.rdir.field_0._28_4_ = fVar56 + fVar56 * auVar61._12_4_;
      auVar61 = vrcpps_avx(auVar62);
      fVar42 = auVar61._0_4_;
      auVar79._0_4_ = auVar62._0_4_ * fVar42;
      fVar52 = auVar61._4_4_;
      auVar79._4_4_ = auVar62._4_4_ * fVar52;
      fVar54 = auVar61._8_4_;
      auVar79._8_4_ = auVar62._8_4_ * fVar54;
      fVar56 = auVar61._12_4_;
      auVar79._12_4_ = auVar62._12_4_ * fVar56;
      auVar62 = vsubps_avx(auVar91,auVar79);
      tray.rdir.field_0._32_4_ = fVar42 + fVar42 * auVar62._0_4_;
      tray.rdir.field_0._36_4_ = fVar52 + fVar52 * auVar62._4_4_;
      tray.rdir.field_0._40_4_ = fVar54 + fVar54 * auVar62._8_4_;
      tray.rdir.field_0._44_4_ = fVar56 + fVar56 * auVar62._12_4_;
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar49,1);
      auVar86._8_4_ = 0x10;
      auVar86._0_8_ = 0x1000000010;
      auVar86._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar62,auVar86);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar49,5);
      auVar61._8_4_ = 0x20;
      auVar61._0_8_ = 0x2000000020;
      auVar61._12_4_ = 0x20;
      auVar87._8_4_ = 0x30;
      auVar87._0_8_ = 0x3000000030;
      auVar87._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar87,auVar61,auVar62);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar49,5);
      auVar80._8_4_ = 0x40;
      auVar80._0_8_ = 0x4000000040;
      auVar80._12_4_ = 0x40;
      auVar88._8_4_ = 0x50;
      auVar88._0_8_ = 0x5000000050;
      auVar88._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar88,auVar80,auVar62);
      auVar62 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar49);
      auVar61 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar49);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar103 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar62,auVar9);
      auVar64 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar62,auVar61,auVar9);
      terminated.field_0.i[1] = auVar9._4_4_ ^ auVar70._4_4_;
      terminated.field_0.i[0] = auVar9._0_4_ ^ auVar70._0_4_;
      terminated.field_0.i[2] = auVar9._8_4_ ^ auVar70._8_4_;
      terminated.field_0.i[3] = auVar9._12_4_ ^ auVar70._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar37 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar33 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1990 = This;
LAB_00eb252e:
      do {
        do {
          root.ptr = pNVar37[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_00eb2fc2;
          pNVar37 = pNVar37 + -1;
          paVar33 = paVar33 + -1;
          aVar105 = *paVar33;
          auVar70 = vcmpps_avx((undefined1  [16])aVar105,(undefined1  [16])tray.tfar.field_0,1);
          uVar29 = vmovmskps_avx(auVar70);
        } while (uVar29 == 0);
        uVar40 = (ulong)(uVar29 & 0xff);
        uVar29 = POPCOUNT(uVar29 & 0xff);
        if (uVar36 < uVar29) {
LAB_00eb256e:
          vVar27.field_0 = terminated.field_0;
          iVar31 = 4;
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00eb2fc2;
              auVar70 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar105,6);
              if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar70[0xf]) goto LAB_00eb252e;
              local_1988 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_19c8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_19c8._8_4_ = terminated.field_0.i[2] ^ 0xffffffff;
              local_19c8._12_4_ = terminated.field_0.i[3] ^ 0xffffffff;
              lVar38 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              lVar32 = 0;
              goto LAB_00eb2782;
            }
            sVar35 = 8;
            aVar105 = auVar103._0_16_;
            for (lVar32 = 0;
                (lVar32 != 4 &&
                (sVar4 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + lVar32 * 8), sVar4 != 8));
                lVar32 = lVar32 + 1) {
              uVar30 = *(undefined4 *)(root.ptr + 0x20 + lVar32 * 4);
              auVar43._4_4_ = uVar30;
              auVar43._0_4_ = uVar30;
              auVar43._8_4_ = uVar30;
              auVar43._12_4_ = uVar30;
              auVar22._8_8_ = tray.org.field_0._8_8_;
              auVar22._0_8_ = tray.org.field_0._0_8_;
              auVar23._8_8_ = tray.org.field_0._24_8_;
              auVar23._0_8_ = tray.org.field_0._16_8_;
              auVar24._8_8_ = tray.org.field_0._40_8_;
              auVar24._0_8_ = tray.org.field_0._32_8_;
              auVar70 = vsubps_avx(auVar43,auVar22);
              auVar81._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar81._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar81._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar81._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x40 + lVar32 * 4);
              auVar44._4_4_ = uVar30;
              auVar44._0_4_ = uVar30;
              auVar44._8_4_ = uVar30;
              auVar44._12_4_ = uVar30;
              auVar70 = vsubps_avx(auVar44,auVar23);
              auVar92._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar92._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar92._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar92._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x60 + lVar32 * 4);
              auVar45._4_4_ = uVar30;
              auVar45._0_4_ = uVar30;
              auVar45._8_4_ = uVar30;
              auVar45._12_4_ = uVar30;
              auVar70 = vsubps_avx(auVar45,auVar24);
              auVar99._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar99._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar99._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar99._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x30 + lVar32 * 4);
              auVar46._4_4_ = uVar30;
              auVar46._0_4_ = uVar30;
              auVar46._8_4_ = uVar30;
              auVar46._12_4_ = uVar30;
              auVar70 = vsubps_avx(auVar46,auVar22);
              auVar57._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar70._0_4_;
              auVar57._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar70._4_4_;
              auVar57._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar70._8_4_;
              auVar57._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar70._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x50 + lVar32 * 4);
              auVar47._4_4_ = uVar30;
              auVar47._0_4_ = uVar30;
              auVar47._8_4_ = uVar30;
              auVar47._12_4_ = uVar30;
              auVar70 = vsubps_avx(auVar47,auVar23);
              auVar65._0_4_ = tray.rdir.field_0._16_4_ * auVar70._0_4_;
              auVar65._4_4_ = tray.rdir.field_0._20_4_ * auVar70._4_4_;
              auVar65._8_4_ = tray.rdir.field_0._24_4_ * auVar70._8_4_;
              auVar65._12_4_ = tray.rdir.field_0._28_4_ * auVar70._12_4_;
              uVar30 = *(undefined4 *)(root.ptr + 0x70 + lVar32 * 4);
              auVar48._4_4_ = uVar30;
              auVar48._0_4_ = uVar30;
              auVar48._8_4_ = uVar30;
              auVar48._12_4_ = uVar30;
              auVar70 = vsubps_avx(auVar48,auVar24);
              auVar72._0_4_ = tray.rdir.field_0._32_4_ * auVar70._0_4_;
              auVar72._4_4_ = tray.rdir.field_0._36_4_ * auVar70._4_4_;
              auVar72._8_4_ = tray.rdir.field_0._40_4_ * auVar70._8_4_;
              auVar72._12_4_ = tray.rdir.field_0._44_4_ * auVar70._12_4_;
              auVar70 = vpminsd_avx(auVar81,auVar57);
              auVar62 = vpminsd_avx(auVar92,auVar65);
              auVar70 = vpmaxsd_avx(auVar70,auVar62);
              auVar62 = vpminsd_avx(auVar99,auVar72);
              auVar62 = vpmaxsd_avx(auVar70,auVar62);
              auVar70 = vpmaxsd_avx(auVar81,auVar57);
              auVar61 = vpmaxsd_avx(auVar92,auVar65);
              auVar61 = vpminsd_avx(auVar70,auVar61);
              auVar70 = vpmaxsd_avx(auVar99,auVar72);
              auVar61 = vpminsd_avx(auVar61,auVar70);
              auVar70 = vpmaxsd_avx(auVar62,(undefined1  [16])tray.tnear.field_0);
              auVar61 = vpminsd_avx(auVar61,(undefined1  [16])tray.tfar.field_0);
              auVar70 = vcmpps_avx(auVar70,auVar61,2);
              auVar64 = ZEXT1664(auVar70);
              sVar34 = sVar35;
              aVar8 = aVar105;
              if (((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar70[0xf] < '\0') &&
                 (aVar8.v = (__m128)vblendvps_avx(auVar103._0_16_,auVar62,auVar70), sVar34 = sVar4,
                 sVar35 != 8)) {
                pNVar37->ptr = sVar35;
                pNVar37 = pNVar37 + 1;
                *paVar33 = aVar105;
                paVar33 = paVar33 + 1;
              }
              aVar105 = aVar8;
              sVar35 = sVar34;
            }
            if (sVar35 == 8) goto LAB_00eb26f8;
            auVar70 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar105,6);
            uVar30 = vmovmskps_avx(auVar70);
            root.ptr = sVar35;
          } while ((byte)uVar36 < (byte)POPCOUNT(uVar30));
          pNVar37->ptr = sVar35;
          pNVar37 = pNVar37 + 1;
          *paVar33 = aVar105;
          paVar33 = paVar33 + 1;
        }
        else {
          while (uVar40 != 0) {
            sVar35 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> sVar35 & 1) == 0; sVar35 = sVar35 + 1) {
              }
            }
            uVar40 = uVar40 & uVar40 - 1;
            auVar64 = ZEXT1664(auVar64._0_16_);
            bVar28 = occluded1(local_1990,local_1998,root,sVar35,&pre,ray,&tray,context);
            if (bVar28) {
              terminated.field_0.i[sVar35] = -1;
            }
          }
          auVar70 = _DAT_01f46b70 & ~(undefined1  [16])terminated.field_0;
          iVar31 = 3;
          auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar70[0xf] < '\0') {
            auVar64 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar70._8_4_ = 0xff800000;
            auVar70._0_8_ = 0xff800000ff800000;
            auVar70._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar70,
                               (undefined1  [16])terminated.field_0);
            iVar31 = 2;
          }
          if (uVar36 < uVar29) goto LAB_00eb256e;
        }
LAB_00eb26f8:
      } while ((iVar31 == 4) || (iVar31 == 2));
LAB_00eb2fc2:
      auVar9 = vandps_avx(auVar9,(undefined1  [16])terminated.field_0);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      auVar9 = vmaskmovps_avx(auVar9,auVar63);
      *(undefined1 (*) [16])pRVar1 = auVar9;
    }
  }
  return;
LAB_00eb2782:
  do {
    lVar39 = -0x10;
    auVar62 = auVar64._0_16_;
    auVar70 = local_19c8;
    if (lVar32 == local_1988) break;
    do {
      local_1980 = lVar32;
      if (lVar39 == 0) break;
      uVar29 = *(uint *)(lVar38 + lVar39);
      if ((ulong)uVar29 == 0xffffffff) break;
      uVar30 = *(undefined4 *)(lVar38 + -0x90 + lVar39);
      auVar49._4_4_ = uVar30;
      auVar49._0_4_ = uVar30;
      auVar49._8_4_ = uVar30;
      auVar49._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar38 + -0x80 + lVar39);
      auVar66._4_4_ = uVar30;
      auVar66._0_4_ = uVar30;
      auVar66._8_4_ = uVar30;
      auVar66._12_4_ = uVar30;
      uVar30 = *(undefined4 *)(lVar38 + -0x70 + lVar39);
      auVar73._4_4_ = uVar30;
      auVar73._0_4_ = uVar30;
      auVar73._8_4_ = uVar30;
      auVar73._12_4_ = uVar30;
      fVar42 = *(float *)(lVar38 + -0x60 + lVar39);
      fVar52 = *(float *)(lVar38 + -0x50 + lVar39);
      fVar54 = *(float *)(lVar38 + -0x40 + lVar39);
      fVar56 = *(float *)(lVar38 + -0x30 + lVar39);
      fVar2 = *(float *)(lVar38 + -0x20 + lVar39);
      fVar3 = *(float *)(lVar38 + -0x10 + lVar39);
      auVar62 = vsubps_avx(auVar49,*(undefined1 (*) [16])ray);
      auVar61 = vsubps_avx(auVar66,*(undefined1 (*) [16])(ray + 0x10));
      auVar49 = vsubps_avx(auVar73,*(undefined1 (*) [16])(ray + 0x20));
      fVar10 = *(float *)(ray + 0x50);
      fVar11 = *(float *)(ray + 0x54);
      fVar12 = *(float *)(ray + 0x58);
      fVar13 = *(float *)(ray + 0x5c);
      fVar14 = *(float *)(ray + 0x60);
      fVar15 = *(float *)(ray + 100);
      fVar16 = *(float *)(ray + 0x68);
      fVar17 = *(float *)(ray + 0x6c);
      fVar93 = auVar49._0_4_;
      auVar100._0_4_ = fVar93 * fVar10;
      fVar95 = auVar49._4_4_;
      auVar100._4_4_ = fVar95 * fVar11;
      fVar96 = auVar49._8_4_;
      auVar100._8_4_ = fVar96 * fVar12;
      fVar97 = auVar49._12_4_;
      auVar100._12_4_ = fVar97 * fVar13;
      fVar78 = auVar61._0_4_;
      auVar109._0_4_ = fVar78 * fVar14;
      fVar83 = auVar61._4_4_;
      auVar109._4_4_ = fVar83 * fVar15;
      fVar84 = auVar61._8_4_;
      auVar109._8_4_ = fVar84 * fVar16;
      fVar85 = auVar61._12_4_;
      auVar109._12_4_ = fVar85 * fVar17;
      auVar79 = vsubps_avx(auVar109,auVar100);
      fVar18 = *(float *)(ray + 0x40);
      fVar19 = *(float *)(ray + 0x44);
      fVar20 = *(float *)(ray + 0x48);
      fVar21 = *(float *)(ray + 0x4c);
      fVar41 = auVar62._0_4_;
      auVar110._0_4_ = fVar41 * fVar14;
      fVar51 = auVar62._4_4_;
      auVar110._4_4_ = fVar51 * fVar15;
      fVar53 = auVar62._8_4_;
      auVar110._8_4_ = fVar53 * fVar16;
      fVar55 = auVar62._12_4_;
      auVar110._12_4_ = fVar55 * fVar17;
      auVar111._0_4_ = fVar93 * fVar18;
      auVar111._4_4_ = fVar95 * fVar19;
      auVar111._8_4_ = fVar96 * fVar20;
      auVar111._12_4_ = fVar97 * fVar21;
      auVar74 = vsubps_avx(auVar111,auVar110);
      auVar112._0_4_ = fVar18 * fVar78;
      auVar112._4_4_ = fVar19 * fVar83;
      auVar112._8_4_ = fVar20 * fVar84;
      auVar112._12_4_ = fVar21 * fVar85;
      auVar75._0_4_ = fVar41 * fVar10;
      auVar75._4_4_ = fVar51 * fVar11;
      auVar75._8_4_ = fVar53 * fVar12;
      auVar75._12_4_ = fVar55 * fVar13;
      auVar71 = vsubps_avx(auVar75,auVar112);
      auVar62 = ZEXT416((uint)(fVar3 * fVar42 - fVar56 * fVar54));
      auVar61 = vshufps_avx(auVar62,auVar62,0);
      auVar62 = ZEXT416((uint)(fVar56 * fVar52 - fVar2 * fVar42));
      auVar49 = vshufps_avx(auVar62,auVar62,0);
      auVar80 = vpermilps_avx(ZEXT416((uint)(fVar2 * fVar54 - fVar3 * fVar52)),0);
      auVar58._0_4_ = fVar18 * auVar80._0_4_ + auVar61._0_4_ * fVar10 + auVar49._0_4_ * fVar14;
      auVar58._4_4_ = fVar19 * auVar80._4_4_ + auVar61._4_4_ * fVar11 + auVar49._4_4_ * fVar15;
      auVar58._8_4_ = fVar20 * auVar80._8_4_ + auVar61._8_4_ * fVar12 + auVar49._8_4_ * fVar16;
      auVar58._12_4_ = fVar21 * auVar80._12_4_ + auVar61._12_4_ * fVar13 + auVar49._12_4_ * fVar17;
      auVar101._8_4_ = 0x80000000;
      auVar101._0_8_ = 0x8000000080000000;
      auVar101._12_4_ = 0x80000000;
      auVar62 = vandps_avx(auVar101,auVar58);
      uVar104 = auVar62._0_4_;
      auVar102._0_4_ =
           uVar104 ^ (uint)(fVar56 * auVar79._0_4_ + fVar2 * auVar74._0_4_ + fVar3 * auVar71._0_4_);
      uVar106 = auVar62._4_4_;
      auVar102._4_4_ =
           uVar106 ^ (uint)(fVar56 * auVar79._4_4_ + fVar2 * auVar74._4_4_ + fVar3 * auVar71._4_4_);
      uVar107 = auVar62._8_4_;
      auVar102._8_4_ =
           uVar107 ^ (uint)(fVar56 * auVar79._8_4_ + fVar2 * auVar74._8_4_ + fVar3 * auVar71._8_4_);
      uVar108 = auVar62._12_4_;
      auVar102._12_4_ =
           uVar108 ^ (uint)(fVar56 * auVar79._12_4_ +
                           fVar2 * auVar74._12_4_ + fVar3 * auVar71._12_4_);
      auVar62 = vcmpps_avx(auVar102,_DAT_01f45a50,5);
      auVar86 = auVar70 & auVar62;
      if ((((auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar86[0xf])
      {
LAB_00eb28f7:
        auVar7._8_8_ = uVar26;
        auVar7._0_8_ = uVar25;
      }
      else {
        auVar62 = vandps_avx(auVar62,auVar70);
        auVar82._0_4_ =
             uVar104 ^ (uint)(auVar79._0_4_ * fVar42 +
                             auVar74._0_4_ * fVar52 + auVar71._0_4_ * fVar54);
        auVar82._4_4_ =
             uVar106 ^ (uint)(auVar79._4_4_ * fVar42 +
                             auVar74._4_4_ * fVar52 + auVar71._4_4_ * fVar54);
        auVar82._8_4_ =
             uVar107 ^ (uint)(auVar79._8_4_ * fVar42 +
                             auVar74._8_4_ * fVar52 + auVar71._8_4_ * fVar54);
        auVar82._12_4_ =
             uVar108 ^ (uint)(auVar79._12_4_ * fVar42 +
                             auVar74._12_4_ * fVar52 + auVar71._12_4_ * fVar54);
        auVar79 = vcmpps_avx(auVar82,_DAT_01f45a50,5);
        auVar74 = auVar62 & auVar79;
        local_1978 = auVar80;
        local_1968 = auVar58;
        if ((((auVar74 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar74 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar74[0xf]
           ) goto LAB_00eb28f7;
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        auVar74 = vandps_avx(auVar76,auVar58);
        auVar62 = vandps_avx(auVar62,auVar79);
        auVar79 = vsubps_avx(auVar74,auVar102);
        auVar79 = vcmpps_avx(auVar79,auVar82,5);
        auVar71 = auVar62 & auVar79;
        if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf]
           ) goto LAB_00eb28f7;
        auVar62 = vandps_avx(auVar79,auVar62);
        auVar77._0_4_ =
             uVar104 ^ (uint)(auVar80._0_4_ * fVar41 +
                             fVar78 * auVar61._0_4_ + auVar49._0_4_ * fVar93);
        auVar77._4_4_ =
             uVar106 ^ (uint)(auVar80._4_4_ * fVar51 +
                             fVar83 * auVar61._4_4_ + auVar49._4_4_ * fVar95);
        auVar77._8_4_ =
             uVar107 ^ (uint)(auVar80._8_4_ * fVar53 +
                             fVar84 * auVar61._8_4_ + auVar49._8_4_ * fVar96);
        auVar77._12_4_ =
             uVar108 ^ (uint)(auVar80._12_4_ * fVar55 +
                             fVar85 * auVar61._12_4_ + auVar49._12_4_ * fVar97);
        auVar89._0_4_ = auVar74._0_4_ * *(float *)(ray + 0x30);
        auVar89._4_4_ = auVar74._4_4_ * *(float *)(ray + 0x34);
        auVar89._8_4_ = auVar74._8_4_ * *(float *)(ray + 0x38);
        auVar89._12_4_ = auVar74._12_4_ * *(float *)(ray + 0x3c);
        auVar94._0_4_ = auVar74._0_4_ * *(float *)(ray + 0x80);
        auVar94._4_4_ = auVar74._4_4_ * *(float *)(ray + 0x84);
        auVar94._8_4_ = auVar74._8_4_ * *(float *)(ray + 0x88);
        auVar94._12_4_ = auVar74._12_4_ * *(float *)(ray + 0x8c);
        auVar79 = vcmpps_avx(auVar89,auVar77,1);
        auVar71 = vcmpps_avx(auVar77,auVar94,2);
        auVar79 = vandps_avx(auVar71,auVar79);
        auVar71 = auVar62 & auVar79;
        if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar71[0xf]
           ) {
LAB_00eb2e60:
          auVar7._8_8_ = uVar26;
          auVar7._0_8_ = uVar25;
        }
        else {
          auVar62 = vandps_avx(auVar79,auVar62);
          auVar79 = vcmpps_avx(auVar58,_DAT_01f45a50,4);
          auVar71 = auVar62 & auVar79;
          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar71 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar71[0xf]) goto LAB_00eb2e60;
          auVar7 = vandps_avx(auVar79,auVar62);
          local_1978._0_8_ = auVar80._0_8_;
          local_1978._8_8_ = auVar80._8_8_;
          local_1848 = local_1978._0_8_;
          uStack_1840 = local_1978._8_8_;
          local_1868 = auVar49;
          local_1858 = auVar61;
          local_1838 = auVar74;
          _local_1828 = auVar77;
          _local_1818 = auVar82;
          _local_1808 = auVar102;
        }
      }
      pGVar5 = (context->scene->geometries).items[uVar29].ptr;
      uVar104 = pGVar5->mask;
      auVar59._4_4_ = uVar104;
      auVar59._0_4_ = uVar104;
      auVar59._8_4_ = uVar104;
      auVar59._12_4_ = uVar104;
      auVar62 = vandps_avx(auVar59,*(undefined1 (*) [16])(ray + 0x90));
      auVar62 = vpcmpeqd_avx(auVar62,_DAT_01f45a50);
      auVar61 = auVar7 & ~auVar62;
      auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar61[0xf] < '\0'
         ) {
        uVar104 = *(uint *)(lVar38 + 0x10 + lVar39);
        auVar62 = vandnps_avx(auVar62,auVar7);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar61 = vrcpps_avx(local_1838);
          fVar42 = auVar61._0_4_;
          auVar60._0_4_ = local_1838._0_4_ * fVar42;
          fVar52 = auVar61._4_4_;
          auVar60._4_4_ = local_1838._4_4_ * fVar52;
          fVar54 = auVar61._8_4_;
          auVar60._8_4_ = local_1838._8_4_ * fVar54;
          fVar56 = auVar61._12_4_;
          auVar60._12_4_ = local_1838._12_4_ * fVar56;
          auVar67._8_4_ = 0x3f800000;
          auVar67._0_8_ = 0x3f8000003f800000;
          auVar67._12_4_ = 0x3f800000;
          auVar61 = vsubps_avx(auVar67,auVar60);
          fVar42 = fVar42 + fVar42 * auVar61._0_4_;
          fVar52 = fVar52 + fVar52 * auVar61._4_4_;
          fVar54 = fVar54 + fVar54 * auVar61._8_4_;
          fVar56 = fVar56 + fVar56 * auVar61._12_4_;
          local_1798._0_8_ = local_1848;
          local_1798._8_8_ = uStack_1840;
          local_1798._16_8_ = local_1858._0_8_;
          local_1798._24_8_ = local_1858._8_8_;
          local_1798._32_8_ = local_1868._0_8_;
          local_1798._40_8_ = local_1868._8_8_;
          local_1768 = CONCAT44(fVar52 * (float)local_1828._4_4_,fVar42 * (float)local_1828._0_4_);
          uStack_1760 = CONCAT44(fVar56 * fStack_181c,fVar54 * fStack_1820);
          local_1758._4_4_ = fVar52 * (float)local_1818._4_4_;
          local_1758._0_4_ = fVar42 * (float)local_1818._0_4_;
          fStack_1750 = fVar54 * fStack_1810;
          fStack_174c = fVar56 * fStack_180c;
          local_1748._4_4_ = fVar52 * (float)local_1808._4_4_;
          local_1748._0_4_ = fVar42 * (float)local_1808._0_4_;
          fStack_1740 = fVar54 * fStack_1800;
          fStack_173c = fVar56 * fStack_17fc;
          args.valid = (int *)&Ng;
          args.geometryUserPtr = &t;
          args.context = (RTCRayQueryContext *)&v;
          args.ray = (RTCRayN *)&u;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::vfloat_impl<4>&,embree::Vec3<embree::vfloat_impl<4>>&>
          ::
          _M_assign<embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::vfloat_impl<4>,embree::Vec3<embree::vfloat_impl<4>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::vfloat_impl<4>_&,_embree::Vec3<embree::vfloat_impl<4>_>_&>
                      *)&args,(_Tuple_impl<0UL,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::Vec3<embree::vfloat_impl<4>_>_>
                               *)&local_1798.field_0);
          local_1738 = vpshufd_avx(ZEXT416(uVar29),0);
          auVar61 = ZEXT416(uVar104);
          _local_1748 = vshufps_avx(auVar61,auVar61,0);
          local_1798._0_8_ = Ng.field_0._0_8_;
          local_1798._8_8_ = Ng.field_0._8_8_;
          local_1798._16_8_ = Ng.field_0._16_8_;
          local_1798._24_8_ = Ng.field_0._24_8_;
          local_1798._32_8_ = Ng.field_0._32_8_;
          local_1798._40_8_ = Ng.field_0._40_8_;
          local_1768 = u.field_0._0_8_;
          uStack_1760 = u.field_0._8_8_;
          _local_1758 = v.field_0;
          vcmpps_avx(ZEXT1632(local_1738),ZEXT1632(local_1738),0xf);
          uStack_1724 = context->user->instID[0];
          local_1728 = uStack_1724;
          uStack_1720 = uStack_1724;
          uStack_171c = uStack_1724;
          uStack_1718 = context->user->instPrimID[0];
          uStack_1714 = uStack_1718;
          uStack_1710 = uStack_1718;
          uStack_170c = uStack_1718;
          auVar61 = *(undefined1 (*) [16])(ray + 0x80);
          auVar49 = vblendvps_avx(auVar61,(undefined1  [16])t.field_0,auVar62);
          *(undefined1 (*) [16])(ray + 0x80) = auVar49;
          args.valid = (int *)local_19a8;
          args.geometryUserPtr = pGVar5->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1798;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          local_19a8 = auVar62;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar5->occlusionFilterN)(&args);
          }
          if (local_19a8 == (undefined1  [16])0x0) {
            auVar62 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
            auVar62 = auVar62 ^ _DAT_01f46b70;
            auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          else {
            p_Var6 = context->args->filter;
            if (p_Var6 == (RTCFilterFunctionN)0x0) {
              auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            else {
              auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&args);
                auVar103 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              }
            }
            auVar49 = vpcmpeqd_avx(local_19a8,_DAT_01f45a50);
            auVar62 = auVar49 ^ _DAT_01f46b70;
            auVar68._8_4_ = 0xff800000;
            auVar68._0_8_ = 0xff800000ff800000;
            auVar68._12_4_ = 0xff800000;
            auVar49 = vblendvps_avx(auVar68,*(undefined1 (*) [16])(args.ray + 0x80),auVar49);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar49;
          }
          auVar49 = vpslld_avx(auVar62,0x1f);
          auVar62 = vpsrad_avx(auVar49,0x1f);
          auVar61 = vblendvps_avx(auVar61,*(undefined1 (*) [16])pRVar1,auVar49);
          *(undefined1 (*) [16])pRVar1 = auVar61;
        }
        auVar70 = vpandn_avx(auVar62,auVar70);
      }
      lVar39 = lVar39 + 4;
      lVar32 = local_1980;
    } while ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar70[0xf] < '\0');
    auVar64 = ZEXT1664(local_19c8);
    auVar61 = vandps_avx(auVar70,local_19c8);
    lVar32 = local_1980 + 1;
    lVar38 = lVar38 + 0xb0;
    auVar70 = local_19c8 & auVar70;
    auVar62 = local_19c8;
    local_19c8 = auVar61;
  } while ((((auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar70[0xf] < '\0');
  auVar70 = vpcmpeqd_avx(auVar62,auVar62);
  auVar50._0_4_ = local_19c8._0_4_ ^ auVar70._0_4_;
  auVar50._4_4_ = local_19c8._4_4_ ^ auVar70._4_4_;
  auVar50._8_4_ = local_19c8._8_4_ ^ auVar70._8_4_;
  auVar50._12_4_ = local_19c8._12_4_ ^ auVar70._12_4_;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vorps_avx(auVar50,(undefined1  [16])vVar27.field_0);
  auVar70 = auVar70 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar70 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar70 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar70 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar70[0xf])
  goto LAB_00eb2fc2;
  auVar64 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
  auVar69._8_4_ = 0xff800000;
  auVar69._0_8_ = 0xff800000ff800000;
  auVar69._12_4_ = 0xff800000;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar69,
                     (undefined1  [16])terminated.field_0);
  goto LAB_00eb252e;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }